

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::benchmarkFailed(ConsoleReporter *this,StringRef error)

{
  ReusableStringStream *this_00;
  TablePrinter *pTVar1;
  ColourGuard guard;
  ColourGuard local_40;
  ColourGuard local_30;
  StringRef local_20;
  
  local_20.m_size = error.m_size;
  local_20.m_start = error.m_start;
  local_30.m_colourImpl =
       Detail::unique_ptr<Catch::ColourImpl>::operator->
                 (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
  local_30.m_code = Red;
  local_30.m_engaged = false;
  ColourImpl::ColourGuard::engageImpl
            (&local_30,(this->super_StreamingReporterBase).super_ReporterBase.m_stream);
  local_40.m_colourImpl = local_30.m_colourImpl;
  local_40.m_code = local_30.m_code;
  local_40.m_engaged = local_30.m_engaged;
  local_30.m_engaged = false;
  ColourImpl::ColourGuard::~ColourGuard(&local_30);
  pTVar1 = Detail::unique_ptr<Catch::TablePrinter>::operator*(&this->m_tablePrinter);
  this_00 = &pTVar1->m_oss;
  ReusableStringStream::operator<<(this_00,(char (*) [19])"Benchmark failed (");
  ReusableStringStream::operator<<(this_00,&local_20);
  local_30.m_colourImpl = (ColourImpl *)CONCAT71(local_30.m_colourImpl._1_7_,0x29);
  ReusableStringStream::operator<<(this_00,(char *)&local_30);
  Catch::operator<<(pTVar1);
  Catch::operator<<(pTVar1);
  ColourImpl::ColourGuard::~ColourGuard(&local_40);
  return;
}

Assistant:

void ConsoleReporter::benchmarkFailed( StringRef error ) {
    auto guard = m_colour->guardColour( Colour::Red ).engage( m_stream );
    (*m_tablePrinter)
        << "Benchmark failed (" << error << ')'
        << ColumnBreak() << RowBreak();
}